

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O1

PSpriteAmiga __thiscall
DataSourceAmiga::decode_interlased_sprite
          (DataSourceAmiga *this,PBuffer *data,size_t width,size_t height,uint8_t compression,
          uint8_t filling,uint8_t *palette,size_t skip_lines)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  byte bVar5;
  int iVar6;
  byte bVar7;
  undefined7 in_register_00000081;
  unsigned_long uVar8;
  int k;
  uint uVar9;
  size_t sVar10;
  bool bVar11;
  PSpriteAmiga PVar12;
  long in_stack_00000018;
  undefined1 local_61;
  long local_60;
  unsigned_long local_40;
  unsigned_long local_38;
  
  local_40 = CONCAT71(in_register_00000081,compression);
  local_60 = in_stack_00000018;
  local_38 = height * 8;
  (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<DataSourceAmiga::SpriteAmiga,std::allocator<DataSourceAmiga::SpriteAmiga>,unsigned_long,unsigned_long&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_DataSourceLegacy).super_DataSourceBase.path,(SpriteAmiga **)this,
             (allocator<DataSourceAmiga::SpriteAmiga> *)&local_61,&local_38,&local_40);
  std::__shared_ptr<DataSourceAmiga::SpriteAmiga,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<DataSourceAmiga::SpriteAmiga,DataSourceAmiga::SpriteAmiga>
            ((__shared_ptr<DataSourceAmiga::SpriteAmiga,(__gnu_cxx::_Lock_policy)2> *)this,
             (SpriteAmiga *)
             (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source);
  lVar1 = *(long *)(*(long *)width + 0x18);
  _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[7];
  iVar6 = 5;
  uVar2 = 5;
  bVar7 = filling;
  do {
    uVar2 = uVar2 + (int)(char)-(bVar7 & 1);
    bVar7 = bVar7 >> 1;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  if (local_40 != 0) {
    uVar8 = 0;
    do {
      if (height != 0) {
        sVar10 = 0;
        do {
          uVar9 = 7;
          do {
            lVar3 = 0;
            iVar6 = 0;
            bVar7 = 0;
            do {
              if ((filling >> ((uint)lVar3 & 0x1f) & 1) == 0) {
                bVar11 = (*(byte *)(lVar1 + local_60 * height * uVar8 + (long)iVar6 * height) >>
                          (uVar9 & 0x1f) & 1) != 0;
                iVar6 = iVar6 + 1;
              }
              else {
                bVar11 = (1 << ((byte)lVar3 & 0x1f) & (uint)(byte)palette) != 0;
              }
              bVar7 = bVar7 * '\x02' | bVar11;
              lVar3 = lVar3 + 1;
            } while (lVar3 != 5);
            iVar6 = 5;
            bVar5 = 0;
            do {
              bVar5 = bVar7 & 1 | bVar5 * '\x02';
              bVar7 = bVar7 >> 1;
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
            lVar3 = (ulong)bVar5 * 3;
            *(code *)((long)&(_Var4._M_pi)->_vptr__Sp_counted_base + 2) =
                 *(code *)(skip_lines + lVar3);
            *(code *)((long)&(_Var4._M_pi)->_vptr__Sp_counted_base + 1) =
                 *(code *)(skip_lines + 1 + lVar3);
            *(code *)&(_Var4._M_pi)->_vptr__Sp_counted_base = *(code *)(skip_lines + 2 + lVar3);
            *(code *)((long)&(_Var4._M_pi)->_vptr__Sp_counted_base + 3) = (code)0xff;
            _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&(_Var4._M_pi)->_vptr__Sp_counted_base + 4);
            bVar11 = uVar9 != 0;
            uVar9 = uVar9 - 1;
          } while (bVar11);
          lVar1 = lVar1 + 1;
          sVar10 = sVar10 + 1;
        } while (sVar10 != height);
      }
      lVar1 = lVar1 + ((ulong)uVar2 - 1) * height;
      uVar8 = uVar8 + 1;
    } while (uVar8 != local_40);
  }
  PVar12.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  PVar12.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (PSpriteAmiga)
         PVar12.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::decode_interlased_sprite(PBuffer data, size_t width,
                                          size_t height,
                                          uint8_t compression,
                                          uint8_t filling,
                                          uint8_t *palette,
                                          size_t skip_lines) {
  PSpriteAmiga sprite = std::make_shared<SpriteAmiga>(width*8, height);

  uint8_t *src = reinterpret_cast<uint8_t*>(data->get_data());
  Data::Sprite::Color *res = sprite->get_writable_data();

  size_t bpp = bitplane_count_from_compression(compression);

  for (size_t y = 0; y < height; y++) {
    for (size_t i = 0; i < width; i++) {
      for (int k = 7; k >= 0; k--) {
        uint8_t color = 0;
        int n = 0;
        for (size_t b = 0; b < 5; b++) {
          color = color << 1;
          if ((compression >> b) & 0x01) {
            if ((filling >> b) & 0x01) {
              color |= 0x01;
            }
          } else {
            color |= ((*(src+(n*width)+((skip_lines*width*y))) >> k) & 0x01);
            n++;
          }
        }
        color = invert5bit(color);
        res->red = palette[color*3+0];    // R
        res->green = palette[color*3+1];  // G
        res->blue = palette[color*3+2];   // B
        res->alpha = 0xFF;                // A
        res++;
      }
      src++;
    }
    src += (bpp-1) * width;
  }

  return sprite;
}